

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall rtosc::Ports::refreshMagic(Ports *this)

{
  pointer pPVar1;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *in_RDI;
  int i;
  Port_Matcher *in_stack_00000098;
  Ports *in_stack_000000a0;
  undefined8 in_stack_ffffffffffffffb8;
  Port_Matcher *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc4;
  int local_18;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pPVar1 = in_RDI[2].super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 != (pointer)0x0) {
    Port_Matcher::~Port_Matcher
              ((Port_Matcher *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    operator_delete(pPVar1,0x80);
  }
  pPVar1 = (pointer)operator_new(0x80);
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::size(in_RDI);
  Port_Matcher::Port_Matcher
            ((Port_Matcher *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar5);
  in_RDI[2].super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar1;
  generate_minimal_hash(in_stack_000000a0,in_stack_00000098);
  local_18 = 0;
  while( true ) {
    iVar5 = local_18;
    sVar2 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::size(in_RDI);
    if ((int)sVar2 <= iVar5) break;
    this_00 = (Port_Matcher *)
              in_RDI[2].super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar5 = local_18;
    pvVar3 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[]
                       (in_RDI,(long)local_18);
    pcVar4 = strchr(pvVar3->name,0x23);
    Port_Matcher::set_enump(this_00,iVar5,pcVar4 != (char *)0x0);
    local_18 = local_18 + 1;
  }
  sVar2 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::size(in_RDI);
  *(int *)&in_RDI[2].super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (int)sVar2;
  return;
}

Assistant:

void Ports::refreshMagic()
{
    delete impl;
    impl = new Port_Matcher(ports.size());
    generate_minimal_hash(*this, *impl);
    for(int i=0; i<(int)ports.size(); ++i)
        impl->set_enump(i, !!strchr(ports[i].name, '#'));

    elms = ports.size();
}